

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.h
# Opt level: O1

array<int,_allocator_default<int>_> *
allocator_default<array<int,_allocator_default<int>_>_>::alloc_array(int size)

{
  long lVar1;
  long *plVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  
  lVar4 = (long)size;
  uVar3 = 0xffffffffffffffff;
  if (-1 < size) {
    uVar3 = lVar4 * 0x10 + 8;
  }
  plVar2 = (long *)operator_new__(uVar3);
  *plVar2 = lVar4;
  if (size != 0) {
    lVar5 = 8;
    do {
      *(undefined8 *)((long)plVar2 + lVar5) = 0;
      array<int,_allocator_default<int>_>::clear
                ((array<int,_allocator_default<int>_> *)((long)plVar2 + lVar5));
      lVar1 = lVar4 * -0x10 + lVar5;
      lVar5 = lVar5 + 0x10;
    } while (lVar1 != -8);
  }
  return (array<int,_allocator_default<int>_> *)(plVar2 + 1);
}

Assistant:

static T *alloc_array(int size) { return new T [size]; }